

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

string * __thiscall
cppcms::json::value::get_abi_cxx11_(string *__return_storage_ptr__,value *this,char *path,char *def)

{
  char cVar1;
  value *v;
  allocator local_19;
  
  v = (value *)cppcms::json::value::find((char *)this);
  cVar1 = cppcms::json::value::is_undefined();
  if (cVar1 == '\0') {
    traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (__return_storage_ptr__,v);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,def,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get(char const *path,char const *def) const
		{
			value const &v=find(path);
			if(v.is_undefined())
				return def;
			try {
				return v.get_value<std::string>();
			}
			catch(std::bad_cast const &e) {
				return def;
			}
		}